

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Events.c
# Opt level: O3

void event_exercise_time(tgestate_t *state)

{
  uint8_t *puVar1;
  byte bVar2;
  long lVar3;
  
  state->bell = '(';
  if (state->in_solitary == '\0') {
    puVar1 = &state->vischars[0].flags;
    *puVar1 = *puVar1 & 0xbf;
    state->vischars[0].route.index = 0x8e;
    state->vischars[0].route.step = '\x04';
    set_route(state,state->vischars);
  }
  bVar2 = 0x8e;
  lVar3 = 0;
  do {
    set_character_route(state,"\f\r\x14\x15\x16\x0e\x0f\x17\x18\x19"[lVar3],(route_t)(bVar2 + 0x400)
                       );
    bVar2 = bVar2 + ((char)lVar3 == '\x04');
    lVar3 = lVar3 + 1;
  } while ((char)lVar3 != '\n');
  return;
}

Assistant:

static void event_exercise_time(tgestate_t *state) // end of exercise time?
{
  assert(state != NULL);

  state->bell = bell_RING_40_TIMES;
  set_route_go_to_yard_reversed(state);
}